

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorImpl<llvm::DWARFGdbIndex::TypeUnitEntry>::resize
          (SmallVectorImpl<llvm::DWARFGdbIndex::TypeUnitEntry> *this,size_type N)

{
  size_t sVar1;
  iterator pTVar2;
  iterator pTVar3;
  iterator E;
  iterator I;
  size_type N_local;
  SmallVectorImpl<llvm::DWARFGdbIndex::TypeUnitEntry> *this_local;
  
  sVar1 = SmallVectorBase::size((SmallVectorBase *)this);
  if (N < sVar1) {
    pTVar2 = SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>::begin
                       ((SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void> *)this)
    ;
    pTVar3 = SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>::end
                       ((SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void> *)this)
    ;
    SmallVectorTemplateBase<llvm::DWARFGdbIndex::TypeUnitEntry,_true>::destroy_range
              (pTVar2 + N,pTVar3);
    SmallVectorBase::set_size((SmallVectorBase *)this,N);
  }
  else {
    sVar1 = SmallVectorBase::size((SmallVectorBase *)this);
    if (sVar1 < N) {
      sVar1 = SmallVectorBase::capacity((SmallVectorBase *)this);
      if (sVar1 < N) {
        SmallVectorTemplateBase<llvm::DWARFGdbIndex::TypeUnitEntry,_true>::grow
                  (&this->super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::TypeUnitEntry,_true>,N)
        ;
      }
      E = SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>::end
                    ((SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void> *)this);
      pTVar2 = SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void>::begin
                         ((SmallVectorTemplateCommon<llvm::DWARFGdbIndex::TypeUnitEntry,_void> *)
                          this);
      for (; E != pTVar2 + N; E = E + 1) {
        memset(E,0,0x18);
      }
      SmallVectorBase::set_size((SmallVectorBase *)this,N);
    }
  }
  return;
}

Assistant:

void resize(size_type N) {
    if (N < this->size()) {
      this->destroy_range(this->begin()+N, this->end());
      this->set_size(N);
    } else if (N > this->size()) {
      if (this->capacity() < N)
        this->grow(N);
      for (auto I = this->end(), E = this->begin() + N; I != E; ++I)
        new (&*I) T();
      this->set_size(N);
    }
  }